

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O1

void __thiscall
Qentem::BigInt<unsigned_int,_1024U>::Add
          (BigInt<unsigned_int,_1024U> *this,uint number,SizeT32 index)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  
  if (number != 0) {
    uVar4 = (ulong)index;
    uVar2 = 0x20;
    if (0x20 < index) {
      uVar2 = (ulong)index;
    }
    iVar5 = 1 - index;
    while (uVar2 != uVar4) {
      uVar1 = this->storage_[uVar4];
      uVar3 = uVar1 + number;
      this->storage_[uVar4] = uVar3;
      uVar4 = uVar4 + 1;
      if (uVar1 < uVar3) {
        uVar2 = (ulong)-(iVar5 + -2 + (uint)(uVar1 < uVar3));
        break;
      }
      number = 1;
      iVar5 = iVar5 + -1;
    }
    uVar1 = (uint)uVar2;
    uVar3 = 0;
    if ((0x1f < uVar1) || (uVar3 = uVar1, this->index_ < uVar1)) {
      this->index_ = uVar3;
    }
  }
  return;
}

Assistant:

void Add(Number_T number, SizeT32 index = 0U) noexcept {
        if (number != 0) {
            while (index <= MaxIndex()) {
                const Number_T tmp = storage_[index];
                storage_[index] += number;

                if (storage_[index] > tmp) {
                    break;
                }

                // Overflow.
                number = Number_T{1};
                ++index;
            }

            if (index > MaxIndex()) {
                index_ = 0;
            } else if (index > index_) {
                index_ = index;
            }
        }
    }